

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

void wasm::readTextData(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *filename,string *input,Module *wasm,IRProfile profile)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string_view in;
  Fatal local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  Err *err;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  Result<wasm::Ok> parsed;
  IRProfile profile_local;
  Module *wasm_local;
  string *input_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *filename_local;
  
  parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = profile;
  local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_88,filename);
  in._M_str = (char *)&local_88;
  in._M_len = local_60._8_8_;
  WATParser::parseModule
            ((Result<wasm::Ok> *)local_50,(WATParser *)wasm,(Module *)local_60._0_8_,in,in_R9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_88);
  local_a0 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_50)->msg;
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal(&local_228);
    Fatal::operator<<(&local_228,local_a0);
    Fatal::~Fatal(&local_228);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_50);
  return;
}

Assistant:

static void readTextData(std::optional<std::string> filename,
                         std::string& input,
                         Module& wasm,
                         IRProfile profile) {
  if (auto parsed = WATParser::parseModule(wasm, input, filename);
      auto err = parsed.getErr()) {
    Fatal() << err->msg;
  }
}